

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BigIndex __thiscall Js::JavascriptArray::BigIndex::operator+(BigIndex *this,BigIndex *delta)

{
  uint uVar1;
  bool bVar2;
  uint32 delta_00;
  uint64 uVar3;
  uint64 uVar4;
  BigIndex BVar5;
  BigIndex *delta_local;
  BigIndex *this_local;
  uint64 local_10;
  
  bVar2 = IsSmallIndex(delta);
  if (bVar2) {
    delta_00 = GetSmallIndex(delta);
    BVar5 = operator+(this,delta_00);
    local_10 = BVar5.bigIndex;
    this_local._0_4_ = BVar5.index;
  }
  else {
    bVar2 = IsSmallIndex(this);
    if (bVar2) {
      uVar1 = this->index;
      uVar3 = GetBigIndex(delta);
      BigIndex((BigIndex *)&this_local,uVar1 + uVar3);
    }
    else {
      uVar3 = this->bigIndex;
      uVar4 = GetBigIndex(delta);
      BigIndex((BigIndex *)&this_local,uVar3 + uVar4);
    }
  }
  BVar5._4_4_ = 0;
  BVar5.index = (uint32)this_local;
  BVar5.bigIndex = local_10;
  return BVar5;
}

Assistant:

JavascriptArray::BigIndex JavascriptArray::BigIndex::operator+(const BigIndex& delta) const
    {
        if (delta.IsSmallIndex())
        {
            return operator+(delta.GetSmallIndex());
        }
        if (IsSmallIndex())
        {
            return index + delta.GetBigIndex();
        }

        return bigIndex + delta.GetBigIndex();
    }